

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

EmitInfo __thiscall Wasm::WasmBytecodeGenerator::EmitSetGlobal(WasmBytecodeGenerator *this)

{
  WasmReaderBase *pWVar1;
  WasmGlobal *global_00;
  EmitInfo local_38;
  EmitInfo info;
  WasmType type;
  RegSlot slot;
  WasmGlobal *global;
  uint32 globalIndex;
  WasmBytecodeGenerator *this_local;
  
  pWVar1 = GetReader(this);
  global_00 = Js::WebAssemblyModule::GetGlobal
                        (this->m_module,(pWVar1->m_currentNode).field_1.brTable.numTargets);
  info.type = Js::WebAssemblyModule::GetOffsetForGlobal(this->m_module,global_00);
  info.super_EmitInfoBase.location = WasmGlobal::GetType(global_00);
  local_38 = PopEvalStack(this,info.super_EmitInfoBase.location,(char16 *)0x0);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x18])
            (this->m_writer,
             (ulong)EmitSetGlobal::globalOpcodes[(int)(info.super_EmitInfoBase.location - 1)],
             (ulong)local_38 & 0xffffffff,1,(ulong)info.type);
  ReleaseLocation(this,&local_38);
  EmitInfo::EmitInfo((EmitInfo *)&this_local);
  return (EmitInfo)this_local;
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitSetGlobal()
{
    uint32 globalIndex = GetReader()->m_currentNode.var.num;
    WasmGlobal* global = m_module->GetGlobal(globalIndex);
    Js::RegSlot slot = m_module->GetOffsetForGlobal(global);

    WasmTypes::WasmType type = global->GetType();
    EmitInfo info = PopEvalStack(type);

    CompileAssert(WasmTypes::I32 == 1);
    CompileAssert(WasmTypes::I64 == 2);
    CompileAssert(WasmTypes::F32 == 3);
    CompileAssert(WasmTypes::F64 == 4);
    static const Js::OpCodeAsmJs globalOpcodes[] = {
        Js::OpCodeAsmJs::StSlot_Int,
        Js::OpCodeAsmJs::StSlot_Long,
        Js::OpCodeAsmJs::StSlot_Flt,
        Js::OpCodeAsmJs::StSlot_Db
    };

    m_writer->AsmSlot(globalOpcodes[type - 1], info.location, WasmBytecodeGenerator::ModuleEnvRegister, slot);
    ReleaseLocation(&info);

    return EmitInfo();
}